

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O0

void __thiscall JSONUTF8StringFilter::push_back(JSONUTF8StringFilter *this,uchar ch)

{
  uchar ch_local;
  JSONUTF8StringFilter *this_local;
  
  if (this->state == 0) {
    if (ch < 0x80) {
      std::__cxx11::string::push_back((char)this->str);
    }
    else if (ch < 0xc0) {
      this->is_valid = false;
    }
    else if (ch < 0xe0) {
      this->codepoint = (ch & 0x1f) << 6;
      this->state = 6;
    }
    else if (ch < 0xf0) {
      this->codepoint = (ch & 0xf) << 0xc;
      this->state = 0xc;
    }
    else if (ch < 0xf8) {
      this->codepoint = (ch & 7) << 0x12;
      this->state = 0x12;
    }
    else {
      this->is_valid = false;
    }
  }
  else {
    if ((ch & 0xc0) != 0x80) {
      this->is_valid = false;
    }
    this->state = this->state + -6;
    this->codepoint = (ch & 0x3f) << ((byte)this->state & 0x1f) | this->codepoint;
    if (this->state == 0) {
      push_back_u(this,this->codepoint);
    }
  }
  return;
}

Assistant:

void push_back(unsigned char ch)
    {
        if (state == 0) {
            if (ch < 0x80) // 7-bit ASCII, fast direct pass-through
                str.push_back(ch);
            else if (ch < 0xc0) // Mid-sequence character, invalid in this state
                is_valid = false;
            else if (ch < 0xe0) { // Start of 2-byte sequence
                codepoint = (ch & 0x1f) << 6;
                state = 6;
            } else if (ch < 0xf0) { // Start of 3-byte sequence
                codepoint = (ch & 0x0f) << 12;
                state = 12;
            } else if (ch < 0xf8) { // Start of 4-byte sequence
                codepoint = (ch & 0x07) << 18;
                state = 18;
            } else // Reserved, invalid
                is_valid = false;
        } else {
            if ((ch & 0xc0) != 0x80) // Not a continuation, invalid
                is_valid = false;
            state -= 6;
            codepoint |= (ch & 0x3f) << state;
            if (state == 0)
                push_back_u(codepoint);
        }
    }